

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

ares_status_t process_write(ares_channel_t *channel,ares_socket_t write_fd)

{
  ares_conn_t *conn_00;
  ares_status_t status;
  ares_conn_t *conn;
  ares_socket_t write_fd_local;
  ares_channel_t *channel_local;
  
  conn_00 = ares_conn_from_fd(channel,write_fd);
  if (conn_00 == (ares_conn_t *)0x0) {
    channel_local._4_4_ = ARES_SUCCESS;
  }
  else {
    if ((conn_00->flags & ARES_CONN_FLAG_TFO_INITIAL) == ARES_CONN_FLAG_NONE) {
      conn_00->state_flags = conn_00->state_flags | ARES_CONN_STATE_CONNECTED;
    }
    channel_local._4_4_ = ares_conn_flush(conn_00);
    if (channel_local._4_4_ != ARES_SUCCESS) {
      handle_conn_error(conn_00,ARES_TRUE,channel_local._4_4_);
    }
  }
  return channel_local._4_4_;
}

Assistant:

static ares_status_t process_write(ares_channel_t *channel,
                                   ares_socket_t   write_fd)
{
  ares_conn_t  *conn = ares_conn_from_fd(channel, write_fd);
  ares_status_t status;

  if (conn == NULL) {
    return ARES_SUCCESS;
  }

  /* Mark as connected if we got here and TFO Initial not set */
  if (!(conn->flags & ARES_CONN_FLAG_TFO_INITIAL)) {
    conn->state_flags |= ARES_CONN_STATE_CONNECTED;
  }

  status = ares_conn_flush(conn);
  if (status != ARES_SUCCESS) {
    handle_conn_error(conn, ARES_TRUE, status);
  }
  return status;
}